

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::PickElement::forward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  Tensor *l;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  const_reference ppTVar4;
  ostream *poVar5;
  void *pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  Tensor *in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  long in_RDI;
  uint b;
  int batch_size;
  uint local_28;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                    ,0x546,
                    "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                   );
    }
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80));
    uVar2 = Dim::batch_elems(&in_RCX->d);
    if (sVar7 != uVar2) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                    ,0x547,
                    "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                   );
    }
    ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    uVar2 = Dim::batch_size(&(*ppTVar4)->d);
    for (local_28 = 0;
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80))
        , local_28 < sVar7; local_28 = local_28 + 1) {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80),
                          (ulong)local_28);
      uVar1 = *pvVar8;
      ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      uVar3 = Dim::rows(&(*ppTVar4)->d);
      if (uVar3 <= uVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "PickElement::forward_impl requested element ");
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80)
                            ,(ulong)local_28);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
        poVar5 = std::operator<<(poVar5," from a vector of length ");
        ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                  operator[](in_RDX,0);
        uVar2 = Dim::rows(&(*ppTVar4)->d);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar2);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        abort();
      }
      ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      l = *ppTVar4;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80),
                          (ulong)local_28);
      TensorTools::CopyElement(l,local_28 * uVar2 + *pvVar8,in_RCX,local_28);
    }
  }
  else {
    uVar2 = **(uint **)(in_RDI + 0x60);
    ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    uVar1 = Dim::rows(&(*ppTVar4)->d);
    if (uVar1 <= uVar2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,**(uint **)(in_RDI + 0x60));
      poVar5 = std::operator<<(poVar5," from a vector of length ");
      ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      uVar2 = Dim::rows(&(*ppTVar4)->d);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar2);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      abort();
    }
    ppTVar4 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    TensorTools::CopyElement(*ppTVar4,**(int **)(in_RDI + 0x60),in_RCX,0);
  }
  return;
}

Assistant:

void PickElement::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << " from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    TensorTools::CopyElement(*xs[0], *pval, fx, 0);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    int batch_size = xs[0]->d.batch_size();
    for(unsigned b = 0; b < pvals->size(); ++b) {
      if ((*pvals)[b] >= xs[0]->d.rows()) {
        cerr << "PickElement::forward_impl requested element " << (*pvals)[b]
             << " from a vector of length " << xs[0]->d.rows() << endl;
        abort();
      }
      TensorTools::CopyElement(*xs[0], b*batch_size + (*pvals)[b], fx, b);
    }
  }
}